

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_show_m(REF_DBL *m)

{
  printf("%24.15e",*m);
  printf("%24.15e",m[1]);
  printf("%24.15e",m[2]);
  putchar(10);
  printf("%24.15e",m[1]);
  printf("%24.15e",m[3]);
  printf("%24.15e",m[4]);
  putchar(10);
  printf("%24.15e",m[2]);
  printf("%24.15e",m[4]);
  printf("%24.15e",m[5]);
  putchar(10);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_show_m(REF_DBL *m) {
  printf("%24.15e", m[0]);
  printf("%24.15e", m[1]);
  printf("%24.15e", m[2]);
  printf("\n");
  printf("%24.15e", m[1]);
  printf("%24.15e", m[3]);
  printf("%24.15e", m[4]);
  printf("\n");
  printf("%24.15e", m[2]);
  printf("%24.15e", m[4]);
  printf("%24.15e", m[5]);
  printf("\n");

  return REF_SUCCESS;
}